

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

int htmlCheckParagraph(htmlParserCtxtPtr ctxt)

{
  xmlChar *str1;
  int iVar1;
  int local_24;
  int i;
  xmlChar *tag;
  htmlParserCtxtPtr ctxt_local;
  
  if (ctxt == (htmlParserCtxtPtr)0x0) {
    ctxt_local._4_4_ = -1;
  }
  else {
    str1 = ctxt->name;
    if (str1 == (xmlChar *)0x0) {
      htmlAutoClose(ctxt,"p");
      htmlCheckImplied(ctxt,"p");
      htmlnamePush(ctxt,"p");
      if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
         (ctxt->sax->startElement != (startElementSAXFunc)0x0)) {
        (*ctxt->sax->startElement)(ctxt->userData,"p",(xmlChar **)0x0);
      }
      ctxt_local._4_4_ = 1;
    }
    else if (htmlOmittedDefaultValue == 0) {
      ctxt_local._4_4_ = 0;
    }
    else {
      for (local_24 = 0; htmlNoContentElements[local_24] != (char *)0x0; local_24 = local_24 + 1) {
        iVar1 = xmlStrEqual(str1,(xmlChar *)htmlNoContentElements[local_24]);
        if (iVar1 != 0) {
          htmlAutoClose(ctxt,"p");
          htmlCheckImplied(ctxt,"p");
          htmlnamePush(ctxt,"p");
          if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
             (ctxt->sax->startElement != (startElementSAXFunc)0x0)) {
            (*ctxt->sax->startElement)(ctxt->userData,"p",(xmlChar **)0x0);
          }
          return 1;
        }
      }
      ctxt_local._4_4_ = 0;
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
htmlCheckParagraph(htmlParserCtxtPtr ctxt) {
    const xmlChar *tag;
    int i;

    if (ctxt == NULL)
	return(-1);
    tag = ctxt->name;
    if (tag == NULL) {
	htmlAutoClose(ctxt, BAD_CAST"p");
	htmlCheckImplied(ctxt, BAD_CAST"p");
	htmlnamePush(ctxt, BAD_CAST"p");
	if ((ctxt->sax != NULL) && (ctxt->sax->startElement != NULL))
	    ctxt->sax->startElement(ctxt->userData, BAD_CAST"p", NULL);
	return(1);
    }
    if (!htmlOmittedDefaultValue)
	return(0);
    for (i = 0; htmlNoContentElements[i] != NULL; i++) {
	if (xmlStrEqual(tag, BAD_CAST htmlNoContentElements[i])) {
	    htmlAutoClose(ctxt, BAD_CAST"p");
	    htmlCheckImplied(ctxt, BAD_CAST"p");
	    htmlnamePush(ctxt, BAD_CAST"p");
	    if ((ctxt->sax != NULL) && (ctxt->sax->startElement != NULL))
		ctxt->sax->startElement(ctxt->userData, BAD_CAST"p", NULL);
	    return(1);
	}
    }
    return(0);
}